

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_replace_object(qpdf_data qpdf,int objid,int generation,qpdf_oh oh)

{
  anon_class_16_3_43942ec8 local_50;
  function<void_(QPDFObjectHandle_&)> local_40;
  qpdf_oh local_1c;
  int local_18;
  qpdf_oh oh_local;
  int generation_local;
  int objid_local;
  qpdf_data qpdf_local;
  
  local_50.qpdf = qpdf;
  local_50.objid = objid;
  local_50.generation = generation;
  local_1c = oh;
  local_18 = generation;
  oh_local = objid;
  _generation_local = qpdf;
  std::function<void(QPDFObjectHandle&)>::function<qpdf_replace_object::__0,void>
            ((function<void(QPDFObjectHandle&)> *)&local_40,&local_50);
  do_with_oh_void(qpdf,oh,&local_40);
  std::function<void_(QPDFObjectHandle_&)>::~function(&local_40);
  return;
}

Assistant:

void
qpdf_replace_object(qpdf_data qpdf, int objid, int generation, qpdf_oh oh)
{
    do_with_oh_void(qpdf, oh, [qpdf, objid, generation](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_replace_object");
        qpdf->qpdf->replaceObject(objid, generation, o);
    });
}